

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_failure.c
# Opt level: O3

void test_open_failure(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  undefined4 local_54;
  undefined4 uStack_50;
  int iStack_4c;
  undefined4 uStack_48;
  int iStack_44;
  undefined4 local_40;
  int iStack_3c;
  undefined8 uStack_38;
  
  iStack_3c = 0;
  uStack_38 = 0;
  uStack_50 = 0;
  iStack_4c = 0;
  uStack_48 = 0;
  iStack_44 = 0;
  local_54 = 0x75bcd15;
  local_40 = 0xffffffe2;
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                   ,L']',(uint)(paVar3 != (archive *)0x0),"a != NULL",(void *)0x0);
  iVar1 = archive_read_open(paVar3,&local_54,my_open,my_read,my_close);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'_',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                      "archive_read_open(a, &private, my_open, my_read, my_close)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'`',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'a',0,"0",(long)iStack_4c,"private.read_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'b',1,"1",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'd',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'e',0,"0",(long)iStack_4c,"private.read_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'f',1,"1",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iStack_3c = 0;
  uStack_38 = 0;
  uStack_50 = 0;
  iStack_4c = 0;
  uStack_48 = 0;
  iStack_44 = 0;
  local_54 = 0x75bcd15;
  local_40 = 0xffffffe7;
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                   ,L'l',(uint)(paVar3 != (archive *)0x0),"a != NULL",(void *)0x0);
  iVar1 = archive_read_open(paVar3,&local_54,my_open,my_read,my_close);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'n',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                      "archive_read_open(a, &private, my_open, my_read, my_close)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'o',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'p',0,"0",(long)iStack_4c,"private.read_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'q',1,"1",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L's',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L't',0,"0",(long)iStack_4c,"private.read_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'u',1,"1",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iStack_3c = 0;
  uStack_38 = 0;
  uStack_50 = 0;
  iStack_4c = 0;
  uStack_48 = 0;
  iStack_44 = 0;
  local_54 = 0x75bcd15;
  local_40 = 0xffffffec;
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                   ,L'{',(uint)(paVar3 != (archive *)0x0),"a != NULL",(void *)0x0);
  iVar1 = archive_read_open(paVar3,&local_54,my_open,my_read,my_close);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'}',-0x14,"ARCHIVE_WARN",(long)iVar1,
                      "archive_read_open(a, &private, my_open, my_read, my_close)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'~',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x7f',0,"0",(long)iStack_4c,"private.read_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x80',1,"1",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x82',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x83',0,"0",(long)iStack_4c,"private.read_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x84',1,"1",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iStack_4c = 0;
  uStack_48 = 0;
  iStack_44 = 0;
  local_40 = 0;
  iStack_3c = 0;
  uStack_38 = 0;
  local_54 = 0x75bcd15;
  uStack_50 = 0xffffffe2;
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                   ,L'\x8b',(uint)(paVar3 != (archive *)0x0),"a != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_compress(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x8d',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_compress(a)",
                      (void *)0x0);
  wVar2 = archive_read_support_format_tar(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x8e',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_tar(a)",
                      (void *)0x0);
  iVar1 = archive_read_open(paVar3,&local_54,my_open,my_read,my_close);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x90',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                      "archive_read_open(a, &private, my_open, my_read, my_close)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x91',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x92',1,"1",(long)iStack_4c,"private.read_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x93',1,"1",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x94',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x95',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x96',1,"1",(long)iStack_4c,"private.read_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x97',1,"1",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iStack_3c = 0;
  uStack_38 = 0;
  uStack_50 = 0;
  iStack_4c = 0;
  uStack_48 = 0;
  iStack_44 = 0;
  local_54 = 0x75bcd15;
  local_40 = 0xffffffe2;
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                   ,L'\x9d',(uint)(paVar3 != (archive *)0x0),"a != NULL",(void *)0x0);
  iVar1 = archive_write_open(paVar3,&local_54,my_open,my_write,my_close);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\x9f',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                      "archive_write_open(a, &private, my_open, my_write, my_close)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'\xa0',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'¡',0,"0",(long)iStack_44,"private.write_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'¢',0,"0",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'£',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'¤',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'¥',0,"0",(long)iStack_44,"private.write_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'¦',0,"0",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iStack_3c = 0;
  uStack_38 = 0;
  uStack_50 = 0;
  iStack_4c = 0;
  uStack_48 = 0;
  iStack_44 = 0;
  local_54 = 0x75bcd15;
  local_40 = 0xffffffe2;
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                   ,L'¬',(uint)(paVar3 != (archive *)0x0),"a != NULL",(void *)0x0);
  archive_write_add_filter_compress(paVar3);
  archive_write_set_format_ustar(paVar3);
  iVar1 = archive_write_open(paVar3,&local_54,my_open,my_write,my_close);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'°',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                      "archive_write_open(a, &private, my_open, my_write, my_close)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'±',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'²',0,"0",(long)iStack_44,"private.write_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'³',0,"0",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'´',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'µ',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'¶',0,"0",(long)iStack_44,"private.write_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'·',0,"0",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iStack_3c = 0;
  uStack_38 = 0;
  uStack_50 = 0;
  iStack_4c = 0;
  uStack_48 = 0;
  iStack_44 = 0;
  local_54 = 0x75bcd15;
  local_40 = 0xffffffe2;
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                   ,L'½',(uint)(paVar3 != (archive *)0x0),"a != NULL",(void *)0x0);
  archive_write_set_format_zip(paVar3);
  iVar1 = archive_write_open(paVar3,&local_54,my_open,my_write,my_close);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'À',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                      "archive_write_open(a, &private, my_open, my_write, my_close)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Á',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Â',0,"0",(long)iStack_44,"private.write_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Ã',0,"0",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Å',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Æ',0,"0",(long)iStack_44,"private.write_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Ç',0,"0",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iStack_3c = 0;
  uStack_38 = 0;
  uStack_50 = 0;
  iStack_4c = 0;
  uStack_48 = 0;
  iStack_44 = 0;
  local_54 = 0x75bcd15;
  local_40 = 0xffffffe2;
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                   ,L'Í',(uint)(paVar3 != (archive *)0x0),"a != NULL",(void *)0x0);
  archive_write_add_filter_gzip(paVar3);
  iVar1 = archive_write_open(paVar3,&local_54,my_open,my_write,my_close);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Ð',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                      "archive_write_open(a, &private, my_open, my_write, my_close)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Ñ',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Ò',0,"0",(long)iStack_44,"private.write_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Ó',0,"0",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Ô',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Õ',1,"1",(long)iStack_3c,"private.open_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'Ö',0,"0",(long)iStack_44,"private.write_called",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L'×',0,"0",(long)uStack_38._4_4_,"private.close_called",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_open_failure)
{
	struct archive *a;
	struct my_data private;

	memset(&private, 0, sizeof(private));
	private.magic = MAGIC;
	private.open_return = ARCHIVE_FATAL;
	a = archive_read_new();
	assert(a != NULL);
	assertEqualInt(ARCHIVE_FATAL,
	    archive_read_open(a, &private, my_open, my_read, my_close));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.read_called);
	assertEqualInt(1, private.close_called);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.read_called);
	assertEqualInt(1, private.close_called);

	memset(&private, 0, sizeof(private));
	private.magic = MAGIC;
	private.open_return = ARCHIVE_FAILED;
	a = archive_read_new();
	assert(a != NULL);
	assertEqualInt(ARCHIVE_FAILED,
	    archive_read_open(a, &private, my_open, my_read, my_close));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.read_called);
	assertEqualInt(1, private.close_called);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.read_called);
	assertEqualInt(1, private.close_called);

	memset(&private, 0, sizeof(private));
	private.magic = MAGIC;
	private.open_return = ARCHIVE_WARN;
	a = archive_read_new();
	assert(a != NULL);
	assertEqualInt(ARCHIVE_WARN,
	    archive_read_open(a, &private, my_open, my_read, my_close));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.read_called);
	assertEqualInt(1, private.close_called);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.read_called);
	assertEqualInt(1, private.close_called);

	memset(&private, 0, sizeof(private));
	private.magic = MAGIC;
	private.open_return = ARCHIVE_OK;
	private.read_return = ARCHIVE_FATAL;
	a = archive_read_new();
	assert(a != NULL);
	assertEqualInt(ARCHIVE_OK,
	    archive_read_support_filter_compress(a));
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_tar(a));
	assertEqualInt(ARCHIVE_FATAL,
	    archive_read_open(a, &private, my_open, my_read, my_close));
	assertEqualInt(1, private.open_called);
	assertEqualInt(1, private.read_called);
	assertEqualInt(1, private.close_called);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assertEqualInt(1, private.open_called);
	assertEqualInt(1, private.read_called);
	assertEqualInt(1, private.close_called);

	memset(&private, 0, sizeof(private));
	private.magic = MAGIC;
	private.open_return = ARCHIVE_FATAL;
	a = archive_write_new();
	assert(a != NULL);
	assertEqualInt(ARCHIVE_FATAL,
	    archive_write_open(a, &private, my_open, my_write, my_close));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.write_called);
	assertEqualInt(0, private.close_called);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.write_called);
	assertEqualInt(0, private.close_called);

	memset(&private, 0, sizeof(private));
	private.magic = MAGIC;
	private.open_return = ARCHIVE_FATAL;
	a = archive_write_new();
	assert(a != NULL);
	archive_write_add_filter_compress(a);
	archive_write_set_format_ustar(a);
	assertEqualInt(ARCHIVE_FATAL,
	    archive_write_open(a, &private, my_open, my_write, my_close));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.write_called);
	assertEqualInt(0, private.close_called);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.write_called);
	assertEqualInt(0, private.close_called);

	memset(&private, 0, sizeof(private));
	private.magic = MAGIC;
	private.open_return = ARCHIVE_FATAL;
	a = archive_write_new();
	assert(a != NULL);
	archive_write_set_format_zip(a);
	assertEqualInt(ARCHIVE_FATAL,
	    archive_write_open(a, &private, my_open, my_write, my_close));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.write_called);
	assertEqualInt(0, private.close_called);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.write_called);
	assertEqualInt(0, private.close_called);

	memset(&private, 0, sizeof(private));
	private.magic = MAGIC;
	private.open_return = ARCHIVE_FATAL;
	a = archive_write_new();
	assert(a != NULL);
	archive_write_add_filter_gzip(a);
	assertEqualInt(ARCHIVE_FATAL,
	    archive_write_open(a, &private, my_open, my_write, my_close));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.write_called);
	assertEqualInt(0, private.close_called);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	assertEqualInt(1, private.open_called);
	assertEqualInt(0, private.write_called);
	assertEqualInt(0, private.close_called);

}